

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

string * __thiscall
cmFindLibraryCommand::FindNormalLibraryDirsPerName_abi_cxx11_
          (string *__return_storage_ptr__,cmFindLibraryCommand *this)

{
  pointer pbVar1;
  string *psVar2;
  Name *pNVar3;
  bool bVar4;
  string *path;
  Name *i;
  Name *name;
  pointer name_00;
  cmFindLibraryHelper helper;
  cmFindLibraryHelper local_110;
  
  cmFindLibraryHelper::cmFindLibraryHelper
            (&local_110,(this->super_cmFindBase).super_cmFindCommon.super_cmCommand.Makefile);
  name_00 = (this->super_cmFindBase).Names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (name_00 != pbVar1) {
    do {
      std::vector<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>::
      _M_erase_at_end(&local_110.Names,
                      local_110.Names.
                      super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      cmFindLibraryHelper::AddName(&local_110,name_00);
      psVar2 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      name = local_110.Names.
             super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
             ._M_impl.super__Vector_impl_data._M_start;
      pNVar3 = local_110.Names.
               super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (path = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          local_110.Names.
          super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>.
          _M_impl.super__Vector_impl_data._M_start = name,
          local_110.Names.
          super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>.
          _M_impl.super__Vector_impl_data._M_finish = pNVar3, path != psVar2; path = path + 1) {
        for (; name != pNVar3; name = name + 1) {
          bVar4 = cmFindLibraryHelper::CheckDirectoryForName(&local_110,path,name);
          if (bVar4) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)__return_storage_ptr__,local_110.BestPath._M_dataplus._M_p,
                       local_110.BestPath._M_dataplus._M_p + local_110.BestPath._M_string_length);
            goto LAB_001f94ca;
          }
        }
        name = local_110.Names.
               super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
               ._M_impl.super__Vector_impl_data._M_start;
        pNVar3 = local_110.Names.
                 super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      name_00 = name_00 + 1;
    } while (name_00 != pbVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_001f94ca:
  cmFindLibraryHelper::~cmFindLibraryHelper(&local_110);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindLibraryCommand::FindNormalLibraryDirsPerName()
{
  // Search the entire path for each name.
  cmFindLibraryHelper helper(this->Makefile);
  for (std::string const& n : this->Names) {
    // Switch to searching for this name.
    helper.SetName(n);

    // Search every directory.
    for (std::string const& sp : this->SearchPaths) {
      if (helper.CheckDirectory(sp)) {
        return helper.BestPath;
      }
    }
  }
  // Couldn't find the library.
  return "";
}